

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O1

string * __thiscall
directories::MADPGetProblemFilename_abi_cxx11_
          (string *__return_storage_ptr__,directories *this,Arguments *args)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  if (*(int *)(this + 0x6c) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)(this + 8),(allocator<char> *)&local_30);
    MADPGetProblemFilename(__return_storage_ptr__,&local_50);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)(this + 8),&local_51);
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"toi-dpomdp","");
    MADPGetProblemFilename(__return_storage_ptr__,&local_50,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string directories::MADPGetProblemFilename(const 
                                           ArgumentHandlers::Arguments &args)
{
    if(args.isTOI)
        return(MADPGetProblemFilename(args.dpf,"toi-dpomdp"));
    else
        return(MADPGetProblemFilename(args.dpf));
}